

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O0

TV __thiscall Nova::Grid<float,_3>::Face(Grid<float,_3> *this,int axis,T_INDEX *index)

{
  float *pfVar1;
  Vector<int,_3,_true> *in_RCX;
  undefined4 in_register_00000034;
  T_STORAGE TVar2;
  Vector<float,_3,_true> local_4c;
  Vector<float,_3,_true> local_40;
  undefined1 local_34 [8];
  TV shifted_index;
  T_INDEX *index_local;
  int axis_local;
  Grid<float,_3> *this_local;
  
  Vector<float,_3,_true>::Vector<int>(&local_40,in_RCX);
  Vector<float,_3,_true>::operator-((Vector<float,_3,_true> *)local_34,0.5);
  pfVar1 = Vector<float,_3,_true>::operator()((Vector<float,_3,_true> *)local_34,(int)index);
  *pfVar1 = *pfVar1 - 0.5;
  Vector<float,_3,_true>::operator*(&local_4c,(Vector<float,_3,_true> *)local_34);
  TVar2._M_elems =
       (_Type)Vector<float,_3,_true>::operator+
                        ((Vector<float,_3,_true> *)this,
                         (Vector<float,_3,_true> *)(CONCAT44(in_register_00000034,axis) + 0xc));
  return (T_STORAGE)(T_STORAGE)TVar2._M_elems;
}

Assistant:

TV Face(const int axis,const T_INDEX& index) const
    {
        TV shifted_index(TV(index)-(T).5);
        shifted_index(axis)-=(T).5;
        return domain.min_corner+shifted_index*dX;
    }